

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_points.h
# Opt level: O3

PrimInfoMB * __thiscall
embree::avx512::PointsISA::createPrimRefMBArray
          (PrimInfoMB *__return_storage_ptr__,PointsISA *this,mvector<PrimRefMB> *prims,BBox1f *t0t1
          ,range<unsigned_long> *r,size_t k,uint geomID)

{
  uint *puVar1;
  BBox1f BVar2;
  undefined4 uVar3;
  long unaff_RBP;
  ulong uVar4;
  float fVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 in_ZMM25 [64];
  undefined1 in_ZMM31 [64];
  undefined1 auVar7 [16];
  
  (__return_storage_ptr__->object_range)._begin = 0;
  (__return_storage_ptr__->object_range)._end = 0;
  uVar4 = r->_begin;
  auVar7 = in_ZMM25._0_16_;
  if (uVar4 < r->_end) {
    aVar6 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vbroadcastss_avx512vl(ZEXT416(0xff800000));
    vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
    auVar7 = vxorps_avx512vl(auVar7,auVar7);
    fVar5 = auVar7._0_4_;
    do {
      auVar9._8_8_ = 0;
      auVar9._0_4_ = (this->super_Points).super_Geometry.time_range.lower;
      auVar9._4_4_ = (this->super_Points).super_Geometry.time_range.upper;
      auVar7 = vmovshdup_avx512vl(auVar9);
      auVar7 = vsubss_avx512f(auVar7,auVar9);
      auVar8 = vsubss_avx512f(ZEXT416((uint)t0t1->upper),auVar9);
      auVar8 = vdivss_avx512f(auVar8,auVar7);
      auVar8 = vmulss_avx512f(auVar8,SUB6416(ZEXT464(0x3f7ffffc),0));
      if ((uVar4 & 0xffffffff) < (((this->super_Points).vertices.items)->super_RawBufferView).num) {
        fVar5 = t0t1->lower;
        auVar10 = ZEXT416((uint)(this->super_Points).super_Geometry.fnumTimeSegments);
        auVar8 = vmulss_avx512f(auVar10,auVar8);
        auVar8 = vrndscaless_avx512f(auVar8,auVar8);
        *(char *)(unaff_RBP + -0xc) = *(char *)(unaff_RBP + -0xc) + (char)uVar4;
        uVar3 = vcvttss2si_avx512f(auVar8);
        auVar8 = vsubss_avx512f(ZEXT416((uint)fVar5),auVar9);
        auVar7 = vdivss_avx512f(auVar8,auVar7);
        auVar7 = vmulss_avx512f(auVar7,SUB6416(ZEXT464(0x3f800002),0));
        auVar7 = vmulss_avx512f(auVar10,auVar7);
        vrndscaless_avx512f(auVar7,auVar7);
        puVar1 = (uint *)(CONCAT44((int)((ulong)prims >> 0x20),uVar3) + -0x5f);
        *puVar1 = *puVar1 | (uint)&stack0xffffffffffffffd0;
        halt_baddata();
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < r->_end);
    (__return_storage_ptr__->object_range)._end = 0;
  }
  else {
    aVar6.m128[2] = -INFINITY;
    aVar6._0_8_ = 0xff800000ff800000;
    aVar6.m128[3] = -INFINITY;
    auVar7 = vxorps_avx512vl(auVar7,auVar7);
    fVar5 = auVar7._0_4_;
  }
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0.m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0.m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0.m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0.m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0 = aVar6;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0.m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0.m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0.m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0.m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0 = aVar6;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = aVar6;
  BVar2 = (BBox1f)vmovlps_avx(SUB6416(ZEXT464(0x3f800000),0));
  __return_storage_ptr__->time_range = BVar2;
  __return_storage_ptr__->num_time_segments = 0;
  __return_storage_ptr__->max_num_time_segments = 0;
  (__return_storage_ptr__->max_time_range).lower = fVar5;
  (__return_storage_ptr__->max_time_range).upper = 1.0;
  return __return_storage_ptr__;
}

Assistant:

PrimInfoMB createPrimRefMBArray(mvector<PrimRefMB>& prims,
                                      const BBox1f& t0t1,
                                      const range<size_t>& r,
                                      size_t k,
                                      unsigned int geomID) const
      {
        PrimInfoMB pinfo(empty);
        for (size_t j = r.begin(); j < r.end(); j++) {
          if (!valid(j, timeSegmentRange(t0t1)))
            continue;
          const PrimRefMB prim(linearBounds(j, t0t1), this->numTimeSegments(), this->time_range, this->numTimeSegments(), geomID, unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }